

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

ZSTDMT_bufferPool * ZSTDMT_expandBufferPool(ZSTDMT_bufferPool *srcBufPool,uint maxNbBuffers)

{
  size_t bSize;
  ZSTD_customMem cMem_00;
  ZSTD_customMem cMem;
  
  if (srcBufPool == (ZSTDMT_bufferPool *)0x0) {
    srcBufPool = (ZSTDMT_bufferPool *)0x0;
  }
  else if (srcBufPool->totalBuffers < maxNbBuffers) {
    cMem_00 = srcBufPool->cMem;
    bSize = srcBufPool->bufferSize;
    ZSTDMT_freeBufferPool(srcBufPool);
    srcBufPool = ZSTDMT_createBufferPool(maxNbBuffers,cMem_00);
    if (srcBufPool != (ZSTDMT_bufferPool *)0x0) {
      ZSTDMT_setBufferSize(srcBufPool,bSize);
    }
  }
  return srcBufPool;
}

Assistant:

static ZSTDMT_bufferPool* ZSTDMT_expandBufferPool(ZSTDMT_bufferPool* srcBufPool, unsigned maxNbBuffers)
{
    if (srcBufPool==NULL) return NULL;
    if (srcBufPool->totalBuffers >= maxNbBuffers) /* good enough */
        return srcBufPool;
    /* need a larger buffer pool */
    {   ZSTD_customMem const cMem = srcBufPool->cMem;
        size_t const bSize = srcBufPool->bufferSize;   /* forward parameters */
        ZSTDMT_bufferPool* newBufPool;
        ZSTDMT_freeBufferPool(srcBufPool);
        newBufPool = ZSTDMT_createBufferPool(maxNbBuffers, cMem);
        if (newBufPool==NULL) return newBufPool;
        ZSTDMT_setBufferSize(newBufPool, bSize);
        return newBufPool;
    }
}